

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_IterationOrderChangesOnRehash_Test::
~Table_IterationOrderChangesOnRehash_Test(Table_IterationOrderChangesOnRehash_Test *this)

{
  Table_IterationOrderChangesOnRehash_Test *this_local;
  
  ~Table_IterationOrderChangesOnRehash_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, IterationOrderChangesOnRehash) {
  std::vector<IntTable> garbage;
  for (int i = 0; i < 5000; ++i) {
    auto t = MakeSimpleTable(20);
    const auto reference = OrderOfIteration(t);
    // Force rehash to the same size.
    t.rehash(0);
    auto trial = OrderOfIteration(t);
    if (trial != reference) {
      // We are done.
      return;
    }
    garbage.push_back(std::move(t));
  }
  FAIL() << "Iteration order remained the same across many attempts.";
}